

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

VOID CorUnix::PROCAddThread(CPalThread *pCurrentThread,CPalThread *pTargetThread)

{
  CPalThread *pTargetThread_local;
  CPalThread *pCurrentThread_local;
  
  InternalEnterCriticalSection(pCurrentThread,&g_csProcess);
  CPalThread::SetNext(pTargetThread,pGThreadList);
  g_dwThreadCount = g_dwThreadCount + 1;
  pGThreadList = pTargetThread;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CPalThread::GetThreadId(pTargetThread);
  InternalLeaveCriticalSection(pCurrentThread,&g_csProcess);
  return;
}

Assistant:

VOID
CorUnix::PROCAddThread(
    CPalThread *pCurrentThread,
    CPalThread *pTargetThread
    )
{
    /* protect the access of the thread list with critical section for
       mutithreading access */
    InternalEnterCriticalSection(pCurrentThread, &g_csProcess);

    pTargetThread->SetNext(pGThreadList);
    pGThreadList = pTargetThread;
    g_dwThreadCount += 1;

    TRACE("Thread 0x%p (id %#x) added to the process thread list\n",
          pTargetThread, pTargetThread->GetThreadId());

    InternalLeaveCriticalSection(pCurrentThread, &g_csProcess);
}